

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

string * perfetto::base::StripSuffix(string *__return_storage_ptr__,string *str,string *suffix)

{
  string *psVar1;
  pointer pcVar2;
  int iVar3;
  string *psVar4;
  
  psVar1 = (string *)suffix->_M_string_length;
  psVar4 = (string *)str->_M_string_length;
  if (psVar1 <= psVar4) {
    iVar3 = ::std::__cxx11::string::compare((ulong)str,(long)psVar4 - (long)psVar1,psVar1);
    psVar4 = (string *)str->_M_string_length;
    if (iVar3 == 0) {
      ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,psVar4 + (long)pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string StripSuffix(const std::string& str, const std::string& suffix) {
  return EndsWith(str, suffix) ? str.substr(0, str.size() - suffix.size())
                               : str;
}